

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

int ON_Solve3x3(double *row0,double *row1,double *row2,double d0,double d1,double d2,double *x_addr,
               double *y_addr,double *z_addr,double *pivot_ratio)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  char cVar9;
  char cVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_30;
  double local_28;
  double local_20;
  
  cVar10 = '\0';
  iVar4 = 0;
  *z_addr = 0.0;
  *y_addr = 0.0;
  *x_addr = 0.0;
  *pivot_ratio = 0.0;
  dVar12 = ABS(*row0);
  dVar14 = ABS(row0[1]);
  cVar9 = dVar12 < dVar14;
  if (dVar14 <= dVar12) {
    dVar14 = dVar12;
  }
  if (dVar14 < ABS(row0[2])) {
    cVar9 = '\x02';
    dVar14 = ABS(row0[2]);
  }
  dVar12 = ABS(*row1);
  if (dVar14 < dVar12) {
    cVar9 = cVar10;
  }
  dVar26 = dVar12;
  if (dVar12 <= dVar14) {
    dVar26 = dVar14;
  }
  dVar17 = ABS(row1[1]);
  dVar15 = dVar26;
  if (dVar26 < dVar17) {
    cVar9 = '\x01';
    dVar15 = dVar17;
  }
  dVar21 = ABS(row1[2]);
  dVar13 = dVar15;
  if (dVar15 < dVar21) {
    cVar9 = '\x02';
    dVar13 = dVar21;
  }
  dVar19 = ABS(*row2);
  dVar27 = dVar19;
  if (dVar19 <= dVar13) {
    dVar27 = dVar13;
    cVar10 = cVar9;
  }
  dVar16 = ABS(row2[1]);
  dVar23 = dVar27;
  if (dVar27 < dVar16) {
    cVar10 = '\x01';
    dVar23 = dVar16;
  }
  dVar25 = ABS(row2[2]);
  dVar11 = dVar23;
  if (dVar23 < dVar25) {
    cVar10 = '\x02';
    dVar11 = dVar25;
  }
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    bVar3 = (-(dVar14 < dVar12) | -(dVar26 < dVar17)) & 1U | dVar15 < dVar21;
    if (dVar23 < dVar25) {
      bVar3 = 2;
    }
    if (dVar27 < dVar16) {
      bVar3 = 2;
    }
    if (dVar13 < dVar19) {
      bVar3 = 2;
    }
    pdVar5 = row1;
    pdVar7 = row0;
    dVar14 = d1;
    local_28 = d0;
    local_20 = d2;
    if ((bVar3 != 1) && (pdVar5 = row0, pdVar7 = row1, dVar14 = d0, local_28 = d1, bVar3 == 2)) {
      pdVar5 = row2;
      row2 = row0;
      dVar14 = d2;
      local_20 = d0;
    }
    dVar12 = *pdVar5;
    dVar26 = pdVar5[1];
    dVar15 = pdVar5[2];
    dVar17 = *pdVar7;
    dVar13 = pdVar7[1];
    dVar21 = *row2;
    dVar27 = row2[1];
    dVar19 = row2[2];
    dVar23 = pdVar7[2];
    pdVar5 = y_addr;
    pdVar7 = x_addr;
    pdVar8 = z_addr;
    dVar16 = dVar21;
    dVar25 = dVar17;
    dVar18 = dVar12;
    dVar20 = dVar27;
    dVar22 = dVar13;
    dVar24 = dVar26;
    if ((cVar10 != '\x02') &&
       (pdVar7 = z_addr, pdVar8 = x_addr, dVar16 = dVar19, dVar25 = dVar23, dVar18 = dVar15,
       dVar19 = dVar21, dVar23 = dVar17, dVar15 = dVar12, cVar10 == '\x01')) {
      pdVar5 = x_addr;
      pdVar8 = y_addr;
      dVar20 = dVar21;
      dVar22 = dVar17;
      dVar24 = dVar12;
      dVar19 = dVar27;
      dVar23 = dVar13;
      dVar15 = dVar26;
    }
    dVar15 = 1.0 / dVar15;
    dVar24 = dVar24 * dVar15;
    dVar18 = dVar18 * dVar15;
    dVar15 = dVar15 * dVar14;
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      dVar22 = dVar22 - dVar23 * dVar24;
      dVar25 = dVar25 - dVar23 * dVar18;
      local_28 = local_28 - dVar23 * dVar15;
    }
    if ((dVar19 != 0.0) || (NAN(dVar19))) {
      dVar20 = dVar20 - dVar19 * dVar24;
      dVar16 = dVar16 - dVar19 * dVar18;
      local_20 = local_20 - dVar19 * dVar15;
    }
    dVar12 = ABS(dVar22);
    dVar26 = ABS(dVar25);
    dVar14 = dVar26;
    if (dVar26 <= dVar12) {
      dVar14 = dVar12;
    }
    dVar13 = ABS(dVar20);
    bVar1 = dVar13 <= dVar14;
    dVar17 = dVar13;
    if (dVar13 <= dVar14) {
      dVar17 = dVar14;
    }
    dVar21 = ABS(dVar16);
    bVar2 = dVar21 <= dVar17;
    if (dVar21 <= dVar17) {
      dVar21 = dVar17;
    }
    iVar4 = 1;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      dVar11 = ABS(dVar11);
      local_30 = dVar21;
      if ((dVar11 < dVar21) || (local_30 = dVar11, dVar11 <= dVar21)) {
        dVar21 = dVar11;
      }
      pdVar6 = pdVar7;
      dVar17 = dVar18;
      dVar27 = dVar20;
      dVar19 = dVar22;
      if (dVar12 < dVar26 && dVar13 <= dVar14 || !bVar2) {
        pdVar6 = pdVar5;
        pdVar5 = pdVar7;
        dVar17 = dVar24;
        dVar27 = dVar16;
        dVar19 = dVar25;
        dVar24 = dVar18;
        dVar16 = dVar20;
        dVar25 = dVar22;
      }
      dVar14 = dVar27;
      if (bVar1 && bVar2) {
        dVar14 = dVar19;
      }
      dVar12 = dVar16;
      if (bVar1 && bVar2) {
        dVar12 = dVar25;
      }
      dVar12 = dVar12 * (1.0 / dVar14);
      dVar26 = local_20;
      dVar13 = dVar12;
      dVar23 = dVar25;
      if (bVar1 && bVar2) {
        dVar26 = local_28;
        dVar13 = dVar16;
        dVar25 = dVar12;
        dVar23 = dVar16;
      }
      dVar26 = (1.0 / dVar14) * dVar26;
      dVar14 = local_28;
      dVar16 = dVar26;
      if (bVar1 && bVar2) {
        dVar14 = dVar26;
        dVar16 = local_20;
      }
      if ((dVar24 != 0.0) || (NAN(dVar24))) {
        dVar17 = dVar17 - dVar24 * dVar12;
        dVar15 = dVar15 - dVar24 * dVar26;
      }
      if (bVar1 && bVar2) {
        dVar19 = dVar27;
      }
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        dVar25 = dVar23 - dVar19 * dVar12;
        dVar13 = dVar12;
        if (bVar1 && bVar2) {
          local_28 = local_20;
          dVar13 = dVar25;
          dVar25 = dVar12;
        }
        local_28 = local_28 - dVar19 * dVar26;
        dVar14 = local_28;
        dVar16 = dVar26;
        if (bVar1 && bVar2) {
          dVar14 = dVar26;
          dVar16 = local_28;
        }
      }
      dVar12 = dVar25;
      if (bVar1 && bVar2) {
        dVar12 = dVar13;
      }
      iVar4 = 2;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        dVar26 = ABS(dVar12);
        dVar27 = dVar26;
        if ((local_30 < dVar26) || (dVar27 = local_30, dVar21 <= dVar26)) {
          local_30 = dVar27;
          dVar26 = dVar21;
        }
        dVar21 = dVar14;
        if (bVar1 && bVar2) {
          dVar21 = dVar16;
        }
        dVar21 = dVar21 / dVar12;
        dVar12 = dVar21;
        dVar27 = dVar16;
        if (bVar1 && bVar2) {
          dVar12 = dVar14;
          dVar13 = dVar25;
          dVar27 = dVar21;
        }
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          if (bVar1 && bVar2) {
            dVar16 = dVar14;
          }
          dVar27 = dVar16 - dVar13 * dVar21;
          dVar12 = dVar21;
          if (bVar1 && bVar2) {
            dVar12 = dVar27;
            dVar27 = dVar21;
          }
        }
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          dVar14 = dVar12;
          if (bVar1 && bVar2) {
            dVar14 = dVar27;
          }
          dVar15 = dVar15 - dVar17 * dVar14;
        }
        *pdVar8 = dVar15;
        dVar14 = dVar27;
        if (bVar1 && bVar2) {
          dVar14 = dVar12;
          dVar12 = dVar27;
        }
        *pdVar5 = dVar14;
        *pdVar6 = dVar12;
        *pivot_ratio = dVar26 / local_30;
        iVar4 = 3;
      }
    }
  }
  return iVar4;
}

Assistant:

int
ON_Solve3x3(const double row0[3], const double row1[3], const double row2[3],
                double d0, double d1, double d2,
                double* x_addr, double* y_addr, double* z_addr,
                double* pivot_ratio)
{
  /* Solve a 3x3 linear system using Gauss-Jordan elimination 
   * with full pivoting.
   */
  int i, j;
  double* p0;
  double* p1;
  double* p2;
  double x, y, workarray[12], maxpiv, minpiv;

  const int sizeof_row = 3*sizeof(row0[0]);

  *pivot_ratio = *x_addr = *y_addr = *z_addr = 0.0;
  x = fabs(row0[0]); i=j=0;
  y = fabs(row0[1]); if (y>x) {x=y;j=1;}
  y = fabs(row0[2]); if (y>x) {x=y;j=2;}
  y = fabs(row1[0]); if (y>x) {x=y;i=1;j=0;}
  y = fabs(row1[1]); if (y>x) {x=y;i=1;j=1;}
  y = fabs(row1[2]); if (y>x) {x=y;i=1;j=2;}
  y = fabs(row2[0]); if (y>x) {x=y;i=2;j=0;}
  y = fabs(row2[1]); if (y>x) {x=y;i=2;j=1;}
  y = fabs(row2[2]); if (y>x) {x=y;i=2;j=2;}
  if (x == 0.0) 
    return 0;
  maxpiv = minpiv = fabs(x);
  p0 = workarray;
  switch(i) {
  case 1: /* swap rows 0 and 1 */
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  case 2: /* swap rows 0 and 2 */
    memcpy(p0,row2,sizeof_row); p0[3] = d2; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0;
    break;
  default:
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  }
  switch(j) {
  case 1: /* swap columns 0 and 1 */
    p0 = x_addr; x_addr = y_addr; y_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x;
    break;
  case 2: /* swap columns 0 and 2 */
    p0 = x_addr; x_addr = z_addr; z_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x;
    break;
  }

  x = 1.0/workarray[0];
  /* debugger set workarray[0] = 1 */
  p0 = p1 = workarray + 1;
  *p1++ *= x; *p1++ *= x; *p1++ *= x;
  x = -(*p1++);
  /* debugger set workarray[4] = 0 */
  if (x == 0.0) 
    p1 += 3;
  else 
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}
  x = -(*p1++);
  /* debugger set workarray[8] = 0 */
  if (x != 0.0)
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}

  x = fabs(workarray[ 5]);i=j=0;
  y = fabs(workarray[ 6]);if (y>x) {x=y;j=1;}
  y = fabs(workarray[ 9]);if (y>x) {x=y;i=1;j=0;}
  y = fabs(workarray[10]);if (y>x) {x=y;i=j=1;}
  if (x == 0.0) 
    return 1; // rank = 1;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  if (j) {
    /* swap columns 1 and 2 */
    p0 = workarray+1;
    p1 = p0+1;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    p0 = y_addr; y_addr = z_addr; z_addr = p0;
  }

  if (i) {
    /* pivot is in row 2 */
    p0 = workarray+1;
    p1 = p0 + 8;
    p2 = p0 + 4;
  }
  else {
    /* pivot is in row 1 */
    p0 = workarray+1;
    p1 = p0 + 4;
    p2 = p0 + 8;
  }

  /* debugger set workarray[5+4*i] = 1 */
  x = 1.0/(*p1++); *p1++ *= x; *p1 *= x; p1--;
  x = -(*p0++);
  /* debugger set p0[-1] = 0 */
  if (x != 0.0) {*p0++ += x*(*p1++); *p0 += x*(*p1); p0--; p1--;}
  x = -(*p2++);
  /* debugger set p2[-1] = 0 */
  if (x != 0.0) {*p2++ += x*(*p1++); *p2 += x*(*p1); p2--; p1--;}
  x = *p2++;
  if (x == 0.0) 
    return 2; // rank = 2;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  /* debugger set p2[-1] = 1 */
  *p2 /= x;
  x = -(*p1++);  if (x != 0.0) *p1 += x*(*p2);
  /* debugger set p1[-1] = 0 */
  x = -(*p0++);  if (x != 0.0) *p0 += x*(*p2);
  /* debugger set p0[-1] = 0 */
  *x_addr = workarray[3];
  if (i) {
    *y_addr = workarray[11];
    *z_addr = workarray[7];
  }
  else {
    *y_addr = workarray[7];
    *z_addr = workarray[11];
  }
  *pivot_ratio = minpiv/maxpiv;
  return 3;
}